

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  undefined8 uVar8;
  size_t sVar9;
  bool bVar10;
  int local_fc;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_d4;
  bool local_c2;
  size_t dotpos;
  size_t olen;
  char *tt;
  char *destname;
  char *tmp;
  FILE *fdest;
  int v;
  int prec;
  int triple;
  int has_alpha;
  int want_gray;
  int two;
  int fails;
  int adjustA;
  int adjustB;
  int adjustG;
  int adjustR;
  uint ncomp;
  uint compno;
  int i;
  int max;
  int hr;
  int wr;
  int *alpha;
  int *blue;
  int *green;
  int *red;
  int force_split_local;
  char *outfile_local;
  opj_image_t *image_local;
  
  _hr = (uint *)0x0;
  uVar1 = image->comps->prec;
  destname = outfile;
  if ((int)uVar1 < 0x11) {
    for (; *destname != '\0'; destname = destname + 1) {
    }
    bVar10 = true;
    if (destname[-2] != 'g') {
      bVar10 = destname[-2] == 'G';
    }
    adjustG = image->numcomps;
    if (bVar10) {
      adjustG = 1;
    }
    if ((force_split == 0) &&
       ((adjustG == 2 ||
        ((((2 < (uint)adjustG && (image->comps->dx == image->comps[1].dx)) &&
          (image->comps[1].dx == image->comps[2].dx)) &&
         (((image->comps->dy == image->comps[1].dy && (image->comps[1].dy == image->comps[2].dy)) &&
          ((image->comps->prec == image->comps[1].prec &&
           (image->comps[1].prec == image->comps[2].prec)))))))))) {
      pFVar6 = fopen(outfile,"wb");
      if (pFVar6 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        image_local._4_4_ = 1;
      }
      else {
        bVar10 = 2 < (uint)adjustG;
        uVar2 = image->comps->w;
        uVar3 = image->comps->h;
        uVar5 = (1 << ((byte)uVar1 & 0x1f)) - 1;
        local_c2 = adjustG == 4 || adjustG == 2;
        green = image->comps->data;
        if (bVar10) {
          blue = image->comps[1].data;
          alpha = image->comps[2].data;
        }
        else {
          alpha = (int *)0x0;
          blue = (int *)0x0;
        }
        if (adjustG == 4 || adjustG == 2) {
          pcVar7 = "GRAYSCALE_ALPHA";
          if (bVar10) {
            pcVar7 = "RGB_ALPHA";
          }
          uVar8 = opj_version();
          fprintf(pFVar6,
                  "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                  ,uVar8,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)adjustG,uVar5,pcVar7);
          _hr = (uint *)image->comps[adjustG - 1].data;
          if (image->comps[adjustG - 1].sgnd == 0) {
            local_d4 = 0;
          }
          else {
            local_d4 = 1 << ((char)image->comps[adjustG - 1].prec - 1U & 0x1f);
          }
          two = local_d4;
        }
        else {
          uVar8 = opj_version();
          fprintf(pFVar6,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar8,(ulong)uVar2,(ulong)uVar3,
                  (ulong)uVar5);
          two = 0;
        }
        if (image->comps->sgnd == 0) {
          local_e4 = 0;
        }
        else {
          local_e4 = 1 << ((char)image->comps->prec - 1U & 0x1f);
        }
        if (bVar10) {
          if (image->comps[1].sgnd == 0) {
            local_e8 = 0;
          }
          else {
            local_e8 = 1 << ((char)image->comps[1].prec - 1U & 0x1f);
          }
          adjustA = local_e8;
          if (image->comps[2].sgnd == 0) {
            local_ec = 0;
          }
          else {
            local_ec = 1 << ((char)image->comps[2].prec - 1U & 0x1f);
          }
          fails = local_ec;
        }
        else {
          fails = 0;
          adjustA = 0;
        }
        for (ncomp = 0; (int)ncomp < (int)(uVar2 * uVar3); ncomp = ncomp + 1) {
          if ((int)uVar1 < 9) {
            fdest._4_4_ = *green;
            if ((int)fdest._4_4_ < 0x100) {
              if ((int)fdest._4_4_ < 0) {
                fdest._4_4_ = 0;
              }
            }
            else {
              fdest._4_4_ = 0xff;
            }
            fprintf(pFVar6,"%c",(ulong)(fdest._4_4_ & 0xff));
            if (bVar10) {
              fdest._4_4_ = *blue;
              if ((int)fdest._4_4_ < 0x100) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xff;
              }
              fprintf(pFVar6,"%c",(ulong)(fdest._4_4_ & 0xff));
              fdest._4_4_ = *alpha;
              if ((int)fdest._4_4_ < 0x100) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xff;
              }
              fprintf(pFVar6,"%c",(ulong)(fdest._4_4_ & 0xff));
              alpha = alpha + 1;
              blue = blue + 1;
            }
            if (local_c2) {
              fdest._4_4_ = *_hr;
              if ((int)fdest._4_4_ < 0x100) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xff;
              }
              fprintf(pFVar6,"%c",(ulong)(fdest._4_4_ & 0xff));
              _hr = _hr + 1;
            }
          }
          else {
            fdest._4_4_ = *green + local_e4;
            if ((int)fdest._4_4_ < 0x10000) {
              if ((int)fdest._4_4_ < 0) {
                fdest._4_4_ = 0;
              }
            }
            else {
              fdest._4_4_ = 0xffff;
            }
            fprintf(pFVar6,"%c%c",(ulong)((int)fdest._4_4_ >> 8 & 0xff),(ulong)(fdest._4_4_ & 0xff))
            ;
            if (bVar10) {
              fdest._4_4_ = *blue + adjustA;
              blue = blue + 1;
              if ((int)fdest._4_4_ < 0x10000) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xffff;
              }
              fprintf(pFVar6,"%c%c",(ulong)((int)fdest._4_4_ >> 8 & 0xff),
                      (ulong)(fdest._4_4_ & 0xff));
              fdest._4_4_ = *alpha + fails;
              alpha = alpha + 1;
              if ((int)fdest._4_4_ < 0x10000) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xffff;
              }
              fprintf(pFVar6,"%c%c",(ulong)((int)fdest._4_4_ >> 8 & 0xff),
                      (ulong)(fdest._4_4_ & 0xff));
            }
            if (local_c2) {
              fdest._4_4_ = *_hr + two;
              _hr = _hr + 1;
              if ((int)fdest._4_4_ < 0x10000) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xffff;
              }
              fprintf(pFVar6,"%c%c",(ulong)((int)fdest._4_4_ >> 8 & 0xff),
                      (ulong)(fdest._4_4_ & 0xff));
            }
          }
          green = green + 1;
        }
        fclose(pFVar6);
        image_local._4_4_ = 0;
      }
    }
    else {
      if ((uint)adjustG < image->numcomps) {
        fprintf(_stderr,"WARNING -> [PGM file] Only the first component\n");
        fprintf(_stderr,"           is written to the file\n");
      }
      sVar9 = strlen(outfile);
      pcVar7 = (char *)malloc(sVar9 + 8);
      if (pcVar7 == (char *)0x0) {
        fprintf(_stderr,"imagetopnm: memory out\n");
        image_local._4_4_ = 1;
      }
      else {
        for (adjustR = 0; (uint)adjustR < (uint)adjustG; adjustR = adjustR + 1) {
          if ((uint)adjustG < 2) {
            sprintf(pcVar7,"%s",outfile);
          }
          else {
            sVar9 = strlen(outfile);
            strncpy(pcVar7,outfile,sVar9 - 4);
            sprintf(pcVar7 + (sVar9 - 4),"_%u.pgm",(ulong)(uint)adjustR);
          }
          pFVar6 = fopen(pcVar7,"wb");
          if (pFVar6 == (FILE *)0x0) {
            fprintf(_stderr,"ERROR -> failed to open %s for writing\n",pcVar7);
            free(pcVar7);
            return 1;
          }
          uVar1 = image->comps[(uint)adjustR].w;
          uVar2 = image->comps[(uint)adjustR].h;
          OVar4 = image->comps[(uint)adjustR].prec;
          uVar8 = opj_version();
          fprintf(pFVar6,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar8,(ulong)uVar1,(ulong)uVar2,
                  (ulong)((1 << ((byte)OVar4 & 0x1f)) - 1));
          green = image->comps[(uint)adjustR].data;
          if (image->comps[(uint)adjustR].sgnd == 0) {
            local_fc = 0;
          }
          else {
            local_fc = 1 << ((char)image->comps[(uint)adjustR].prec - 1U & 0x1f);
          }
          if ((int)OVar4 < 9) {
            for (ncomp = 0; (int)ncomp < (int)(uVar1 * uVar2); ncomp = ncomp + 1) {
              fdest._4_4_ = *green + local_fc;
              green = green + 1;
              if ((int)fdest._4_4_ < 0x100) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xff;
              }
              fprintf(pFVar6,"%c",(ulong)(fdest._4_4_ & 0xff));
            }
          }
          else {
            for (ncomp = 0; (int)ncomp < (int)(uVar1 * uVar2); ncomp = ncomp + 1) {
              fdest._4_4_ = *green + local_fc;
              green = green + 1;
              if ((int)fdest._4_4_ < 0x10000) {
                if ((int)fdest._4_4_ < 0) {
                  fdest._4_4_ = 0;
                }
              }
              else {
                fdest._4_4_ = 0xffff;
              }
              fprintf(pFVar6,"%c%c",(ulong)((int)fdest._4_4_ >> 8 & 0xff),
                      (ulong)(fdest._4_4_ & 0xff));
            }
          }
          fclose(pFVar6);
        }
        free(pcVar7);
        image_local._4_4_ = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/bin/jp2/convert.c"
            ,0x6ea,(ulong)uVar1);
    image_local._4_4_ = 1;
  }
  return image_local._4_4_;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if((prec = (int)image->comps[0].prec) > 16)
    {
        fprintf(stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n",__FILE__,__LINE__,prec);
        return 1;
    }
    two = has_alpha = 0; fails = 1;
    ncomp = image->numcomps;

    while (*tmp) ++tmp; tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if(want_gray) ncomp = 1;

    if ((force_split == 0) &&
				(ncomp == 2 /* GRAYA */
            || (ncomp > 2 /* RGB, RGBA */
                && image->comps[0].dx == image->comps[1].dx
                && image->comps[1].dx == image->comps[2].dx
                && image->comps[0].dy == image->comps[1].dy
                && image->comps[1].dy == image->comps[2].dy
                && image->comps[0].prec == image->comps[1].prec
                && image->comps[1].prec == image->comps[2].prec
                )))
		{
        fdest = fopen(outfile, "wb");

        if (!fdest)
        {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w; hr = (int)image->comps[0].h;
        max = (1<<prec) - 1; has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;

        if(triple)
        {
            green = image->comps[1].data;
            blue = image->comps[2].data;
        }
        else green = blue = NULL;

        if(has_alpha)
        {
            const char *tt = (triple?"RGB_ALPHA":"GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                        1 << (image->comps[ncomp - 1].prec - 1) : 0);
        }
        else
        {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if(triple)
        {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        }
        else adjustG = adjustB = 0;

        for(i = 0; i < wr * hr; ++i)
        {
            if(two)
            {
                v = *red + adjustR; ++red;
                if(v > 65535) v = 65535; else if(v < 0) v = 0;

                /* netpbm: */
                fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                if(triple)
                {
                    v = *green + adjustG; ++green;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                    v =  *blue + adjustB; ++blue;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                }/* if(triple) */

                if(has_alpha)
                {
                    v = *alpha + adjustA; ++alpha;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);
                }
                continue;

            }	/* if(two) */

            /* prec <= 8: */
            v = *red++;
            if(v > 255) v = 255; else if(v < 0) v = 0;

            fprintf(fdest, "%c", (unsigned char)v);
            if(triple)
            {
                v = *green++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
						}
            if(has_alpha)
            {
                v = *alpha++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }	/* for(i */

        fclose(fdest); return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp)
    {
        fprintf(stderr,"WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr,"           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if(destname == NULL){
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++)
    {
        if (ncomp > 1)
        {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            strncpy(destname, outfile, dotpos);
            sprintf(destname+dotpos, "_%u.pgm", compno);
        }
        else
            sprintf(destname, "%s", outfile);

        fdest = fopen(destname, "wb");
        if (!fdest)
        {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w; hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1<<prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        adjustR =
                (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if(prec > 8)
        {
            for (i = 0; i < wr * hr; i++)
            {
                v = *red + adjustR; ++red;
                if(v > 65535) v = 65535; else if(v < 0) v = 0;

                /* netpbm: */
                fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                if(has_alpha)
                {
                    v = *alpha++;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);
                }
            }/* for(i */
        }
        else /* prec <= 8 */
        {
            for(i = 0; i < wr * hr; ++i)
            {
                v = *red + adjustR; ++red;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}